

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

QRectF * __thiscall
QWidgetTextControl::selectionRect
          (QRectF *__return_storage_ptr__,QWidgetTextControl *this,QTextCursor *cursor)

{
  QWidgetTextControlPrivate *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Position PVar5;
  long lVar6;
  undefined8 uVar7;
  long *plVar8;
  qreal extraout_RDX;
  qreal extraout_RDX_00;
  undefined1 *puVar9;
  QTextFrame **ppQVar10;
  int i;
  QTextFrame **ppQVar11;
  undefined1 *puVar12;
  long in_FS_OFFSET;
  qreal qVar13;
  double dVar14;
  QRectF r;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  QRectF local_b8;
  QArrayDataPointer<QTextFrame_*> local_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
  iVar2 = QTextCursor::selectionStart();
  QWidgetTextControlPrivate::rectForPosition(__return_storage_ptr__,this_00,iVar2);
  cVar1 = QTextCursor::hasComplexSelection();
  if ((cVar1 != '\0') && (lVar6 = QTextCursor::currentTable(), lVar6 != 0)) {
    uVar7 = QTextCursor::currentTable();
    plVar8 = (long *)QTextDocument::documentLayout();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*plVar8 + 0x80))(__return_storage_ptr__,plVar8,uVar7);
      return __return_storage_ptr__;
    }
    goto LAB_0047c1ff;
  }
  cVar1 = QTextCursor::hasSelection();
  if (cVar1 != '\0') {
    QTextCursor::selectionStart();
    QTextCursor::selectionEnd();
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_68);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_78);
    if (local_68 == local_78) {
      if (((int)puStack_60 != (int)puStack_70) || (cVar1 = QTextBlock::isValid(), cVar1 == '\0'))
      goto LAB_0047bf6f;
      QTextBlock::layout();
      iVar2 = QTextLayout::lineCount();
      if (iVar2 == 0) goto LAB_0047bf6f;
      iVar2 = QTextBlock::layout();
      QTextBlock::position();
      iVar3 = QTextLayout::lineForTextPosition(iVar2);
      iVar2 = QTextBlock::layout();
      QTextBlock::position();
      iVar4 = QTextLayout::lineForTextPosition(iVar2);
      iVar2 = iVar4;
      if (iVar3 < iVar4) {
        iVar2 = iVar3;
      }
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      iVar3 = QTextBlock::layout();
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      for (; iVar2 <= iVar4; iVar2 = iVar2 + 1) {
        local_b8.xp._0_4_ = QTextLayout::lineAt(iVar3);
        local_b8.yp = extraout_RDX;
        QTextLine::rect();
        QRectF::operator|=(__return_storage_ptr__,&local_58);
        local_b8.xp._0_4_ = QTextLayout::lineAt(iVar3);
        local_b8.yp = extraout_RDX_00;
        QTextLine::naturalTextRect();
        QRectF::operator|=(__return_storage_ptr__,&local_58);
      }
      (**(code **)(*(long *)this + 0x80))(&local_58,this,&local_68);
      __return_storage_ptr__->xp =
           __return_storage_ptr__->xp + (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
      __return_storage_ptr__->yp =
           __return_storage_ptr__->yp + (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
      qVar13 = __return_storage_ptr__->w;
    }
    else {
LAB_0047bf6f:
      local_b8.w._0_4_ = 0xffffffff;
      local_b8.w._4_4_ = 0xffffffff;
      local_b8.h._0_4_ = 0xffffffff;
      local_b8.h._4_4_ = 0xffffffff;
      local_b8.xp._0_4_ = 0xffffffff;
      local_b8.xp._4_4_ = 0xffffffff;
      local_b8.yp = -NAN;
      iVar2 = QTextCursor::selectionEnd();
      QWidgetTextControlPrivate::rectForPosition(&local_b8,this_00,iVar2);
      QRectF::operator|=(__return_storage_ptr__,&local_b8);
      local_c8 = (undefined1  [16])0x0;
      local_d8 = (undefined1  [16])0x0;
      QTextCursor::currentFrame();
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::childFrames();
      puVar12 = (undefined1 *)local_98.size;
      ppQVar11 = local_98.ptr;
      iVar2 = QTextCursor::selectionStart();
      while (puVar9 = puVar12, puVar12 = (undefined1 *)local_98.size, ppQVar10 = local_98.ptr,
            0 < (long)puVar9) {
        puVar12 = (undefined1 *)((ulong)puVar9 >> 1);
        iVar4 = QTextFrame::firstPosition();
        if (iVar4 < iVar2) {
          ppQVar11 = ppQVar11 + (long)(puVar12 + 1);
          puVar12 = puVar9 + ~(ulong)puVar12;
        }
      }
      iVar2 = QTextCursor::selectionEnd();
      while (puVar9 = puVar12, 0 < (long)puVar9) {
        puVar12 = (undefined1 *)((ulong)puVar9 >> 1);
        iVar4 = QTextFrame::firstPosition();
        if (iVar4 <= iVar2) {
          ppQVar10 = ppQVar10 + (long)(puVar12 + 1);
          puVar12 = puVar9 + ~(ulong)puVar12;
        }
      }
      for (; ppQVar11 != ppQVar10; ppQVar11 = ppQVar11 + 1) {
        QTextFrame::frameFormat((QTextFrame *)&local_58);
        PVar5 = QTextFrameFormat::position((QTextFrameFormat *)&local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&local_58);
        if (PVar5 != InFlow) {
          QTextObject::document();
          plVar8 = (long *)QTextDocument::documentLayout();
          (**(code **)(*plVar8 + 0x80))(&local_58,plVar8,*ppQVar11);
          QRectF::operator|=((QRectF *)local_d8,&local_58);
        }
      }
      QArrayDataPointer<QTextFrame_*>::~QArrayDataPointer(&local_98);
      QRectF::operator|=(__return_storage_ptr__,(QRectF *)local_d8);
      local_58.w._0_4_ = 0xffffffff;
      local_58.w._4_4_ = 0xffffffff;
      local_58.h._0_4_ = 0xffffffff;
      local_58.h._4_4_ = 0xffffffff;
      local_58.xp._0_4_ = 0xffffffff;
      local_58.xp._4_4_ = 0xffffffff;
      local_58.yp._0_4_ = 0xffffffff;
      local_58.yp._4_4_ = 0xffffffff;
      plVar8 = (long *)QTextDocument::documentLayout();
      uVar7 = QTextCursor::currentFrame();
      (**(code **)(*plVar8 + 0x80))(&local_58,plVar8,uVar7);
      dVar14 = ((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) - __return_storage_ptr__->xp)
               + __return_storage_ptr__->xp;
      __return_storage_ptr__->xp = dVar14;
      qVar13 = ((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) +
               (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_)) - dVar14;
      __return_storage_ptr__->w = qVar13;
    }
    if ((0.0 < qVar13) && (0.0 < __return_storage_ptr__->h)) {
      QRectF::adjust(__return_storage_ptr__,-1.0,-1.0,1.0,1.0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0047c1ff:
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetTextControl::selectionRect(const QTextCursor &cursor) const
{
    Q_D(const QWidgetTextControl);

    QRectF r = d->rectForPosition(cursor.selectionStart());

    if (cursor.hasComplexSelection() && cursor.currentTable()) {
        QTextTable *table = cursor.currentTable();

        r = d->doc->documentLayout()->frameBoundingRect(table);
        /*
        int firstRow, numRows, firstColumn, numColumns;
        cursor.selectedTableCells(&firstRow, &numRows, &firstColumn, &numColumns);

        const QTextTableCell firstCell = table->cellAt(firstRow, firstColumn);
        const QTextTableCell lastCell = table->cellAt(firstRow + numRows - 1, firstColumn + numColumns - 1);

        const QAbstractTextDocumentLayout * const layout = doc->documentLayout();

        QRectF tableSelRect = layout->blockBoundingRect(firstCell.firstCursorPosition().block());

        for (int col = firstColumn; col < firstColumn + numColumns; ++col) {
            const QTextTableCell cell = table->cellAt(firstRow, col);
            const qreal y = layout->blockBoundingRect(cell.firstCursorPosition().block()).top();

            tableSelRect.setTop(qMin(tableSelRect.top(), y));
        }

        for (int row = firstRow; row < firstRow + numRows; ++row) {
            const QTextTableCell cell = table->cellAt(row, firstColumn);
            const qreal x = layout->blockBoundingRect(cell.firstCursorPosition().block()).left();

            tableSelRect.setLeft(qMin(tableSelRect.left(), x));
        }

        for (int col = firstColumn; col < firstColumn + numColumns; ++col) {
            const QTextTableCell cell = table->cellAt(firstRow + numRows - 1, col);
            const qreal y = layout->blockBoundingRect(cell.lastCursorPosition().block()).bottom();

            tableSelRect.setBottom(qMax(tableSelRect.bottom(), y));
        }

        for (int row = firstRow; row < firstRow + numRows; ++row) {
            const QTextTableCell cell = table->cellAt(row, firstColumn + numColumns - 1);
            const qreal x = layout->blockBoundingRect(cell.lastCursorPosition().block()).right();

            tableSelRect.setRight(qMax(tableSelRect.right(), x));
        }

        r = tableSelRect.toRect();
        */
    } else if (cursor.hasSelection()) {
        const int position = cursor.selectionStart();
        const int anchor = cursor.selectionEnd();
        const QTextBlock posBlock = d->doc->findBlock(position);
        const QTextBlock anchorBlock = d->doc->findBlock(anchor);
        if (posBlock == anchorBlock && posBlock.isValid() && posBlock.layout()->lineCount()) {
            const QTextLine posLine = posBlock.layout()->lineForTextPosition(position - posBlock.position());
            const QTextLine anchorLine = anchorBlock.layout()->lineForTextPosition(anchor - anchorBlock.position());

            const int firstLine = qMin(posLine.lineNumber(), anchorLine.lineNumber());
            const int lastLine = qMax(posLine.lineNumber(), anchorLine.lineNumber());
            const QTextLayout *layout = posBlock.layout();
            r = QRectF();
            for (int i = firstLine; i <= lastLine; ++i) {
                r |= layout->lineAt(i).rect();
                r |= layout->lineAt(i).naturalTextRect(); // might be bigger in the case of wrap not enabled
            }
            r.translate(blockBoundingRect(posBlock).topLeft());
        } else {
            QRectF anchorRect = d->rectForPosition(cursor.selectionEnd());
            r |= anchorRect;
            r |= boundingRectOfFloatsInSelection(cursor);
            QRectF frameRect(d->doc->documentLayout()->frameBoundingRect(cursor.currentFrame()));
            r.setLeft(frameRect.left());
            r.setRight(frameRect.right());
        }
        if (r.isValid())
            r.adjust(-1, -1, 1, 1);
    }

    return r;
}